

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::crate::CrateReader::GetFieldValuePair
          (expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CrateReader *this,FieldValuePairVector *fvs,string *name,
          string *tyname)

{
  pointer ppVar1;
  __type _Var2;
  pointer value;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  value = (fvs->
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (fvs->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (value == ppVar1) {
      ::std::operator+(&local_90,"FieldValuePair not found with name: `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name);
      ::std::operator+(&local_70,&local_90,"` and specified type: `");
      ::std::operator+(&local_50,&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tyname);
      ::std::operator+(&local_b0,&local_50,"`");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
        local_d0.field_2._8_8_ = local_b0.field_2._8_8_;
      }
      else {
        local_d0._M_dataplus._M_p = local_b0._M_dataplus._M_p;
      }
      local_d0._M_string_length = local_b0._M_string_length;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      nonstd::expected_lite::
      expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      return __return_storage_ptr__;
    }
    _Var2 = ::std::operator==(&value->first,name);
    if (_Var2) {
      linb::any::type_name_abi_cxx11_(&local_d0,(any *)&value->second);
      _Var2 = ::std::operator==(&local_d0,tyname);
      ::std::__cxx11::string::_M_dispose();
      if (_Var2) {
        nonstd::expected_lite::
        expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        expected<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_0>
                  (__return_storage_ptr__,value);
        return __return_storage_ptr__;
      }
    }
    value = value + 1;
  } while( true );
}

Assistant:

nonstd::expected<FieldValuePair, std::string>
CrateReader::GetFieldValuePair(const FieldValuePairVector &fvs,
                               const std::string &name,
                               const std::string &tyname) {
  for (const auto &fv : fvs) {
    if ((fv.first == name) && (fv.second.type_name() == tyname)) {
      return fv;
    }
  }

  return nonstd::make_unexpected("FieldValuePair not found with name: `" +
                                 name + "` and specified type: `" + tyname +
                                 "`");
}